

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O3

void diy::Serialization<diy::DynamicPoint<float,_4UL>_>::load(BinaryBuffer *bb,Point *p)

{
  size_t s;
  size_type local_20;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_20,8);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::resize
            (&p->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,local_20);
  if (local_20 != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(p->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin,
               local_20 << 2);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Point& p)
    {
      size_t s;
      diy::load(bb, s);
      p.resize(s);
      if (s > 0)
        diy::load(bb, &p[0], s);
    }